

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Write
          (TextGenerator *this,char *data,size_t size)

{
  bool bVar1;
  int iVar2;
  char *in_RAX;
  size_t __n;
  char *local_38;
  void *void_buffer;
  
  if ((size != 0) && (this->failed_ == false)) {
    local_38 = in_RAX;
    if (this->at_start_of_line_ == true) {
      this->at_start_of_line_ = false;
      WriteIndent(this);
      if (this->failed_ != false) {
        return;
      }
    }
    iVar2 = this->buffer_size_;
    __n = (size_t)iVar2;
    if (__n < size) {
      do {
        if (0 < iVar2) {
          memcpy(this->buffer_,data,__n);
          data = data + this->buffer_size_;
          size = size - (long)this->buffer_size_;
        }
        local_38 = (char *)0x0;
        iVar2 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                          (this->output_,&local_38,&this->buffer_size_);
        bVar1 = (bool)((byte)iVar2 ^ 1);
        this->failed_ = bVar1;
        if (bVar1 != false) {
          return;
        }
        this->buffer_ = local_38;
        iVar2 = this->buffer_size_;
        __n = (size_t)iVar2;
      } while (__n < size);
    }
    memcpy(this->buffer_,data,size);
    this->buffer_ = this->buffer_ + size;
    this->buffer_size_ = this->buffer_size_ - (int)size;
  }
  return;
}

Assistant:

void Write(const char* data, size_t size) {
    if (failed_) return;
    if (size == 0) return;

    if (at_start_of_line_) {
      // Insert an indent.
      at_start_of_line_ = false;
      WriteIndent();
      if (failed_) return;
    }

    while (size > buffer_size_) {
      // Data exceeds space in the buffer.  Copy what we can and request a
      // new buffer.
      if (buffer_size_ > 0) {
        memcpy(buffer_, data, buffer_size_);
        data += buffer_size_;
        size -= buffer_size_;
      }
      void* void_buffer = nullptr;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memcpy(buffer_, data, size);
    buffer_ += size;
    buffer_size_ -= size;
  }